

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

QTreeWidgetItem * __thiscall QTreeWidget::currentItem(QTreeWidget *this)

{
  QTreeWidgetPrivate *this_00;
  QTreeWidgetItem *pQVar1;
  long in_FS_OFFSET;
  QModelIndex local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeWidgetPrivate **)
             &(this->super_QTreeView).super_QAbstractItemView.super_QAbstractScrollArea.super_QFrame
              .super_QWidget.field_0x8;
  QAbstractItemView::currentIndex(&local_30,(QAbstractItemView *)this);
  pQVar1 = QTreeWidgetPrivate::item(this_00,&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidgetItem *QTreeWidget::currentItem() const
{
    Q_D(const QTreeWidget);
    return d->item(currentIndex());
}